

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitSIMDLoadStoreLane
          (Flow *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,
          SIMDLoadStoreLane *curr)

{
  Name memory;
  char cVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  undefined4 uVar5;
  Address AVar6;
  Flow *pFVar7;
  long lVar8;
  uint64_t rhs;
  uint64_t uVar9;
  undefined1 local_320 [8];
  array<wasm::Literal,_16UL> lanes;
  MemoryInstanceInfo info;
  Literal local_170;
  Literal local_158;
  Literal local_140;
  undefined1 local_128 [8];
  Flow ptrFlow;
  Flow vecFlow;
  long local_88;
  undefined1 local_78 [8];
  Literal vec;
  
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
            ((Flow *)local_128,
             &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
             *(Expression **)(curr + 0x30));
  if (ptrFlow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
              ((Flow *)&ptrFlow.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
               *(Expression **)(curr + 0x38));
    if (vecFlow.breakTo.super_IString.str._M_len == 0) {
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)&lanes._M_elems[0xf].type,this,
                 (Name)*(string_view *)(curr + 0x40));
      memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
      memory.super_IString.str._M_len = (size_t)info.instance;
      AVar6 = getMemorySize((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                            lanes._M_elems[0xf].type.id,memory);
      if (((long)((long)ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
          3) * -0x5555555555555555 + (long)local_128 != 1) {
LAB_0013112d:
        __assert_fail("values.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x52,"const Literal &wasm::Flow::getSingleValue()");
      }
      wasm::Literal::Literal
                ((Literal *)&vecFlow.breakTo.super_IString.str._M_str,(Literal *)&ptrFlow);
      uVar4 = wasm::SIMDLoadStoreLane::getMemBytes();
      if (local_88 == 3) {
        uVar9 = CONCAT44(vecFlow.breakTo.super_IString.str._M_str._4_4_,
                         (int)vecFlow.breakTo.super_IString.str._M_str);
      }
      else {
        if (local_88 != 2) goto LAB_0013114c;
        uVar9 = (uint64_t)(int)vecFlow.breakTo.super_IString.str._M_str;
      }
      rhs = AVar6.addr * 0x10000;
      trapIfGt((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
               lanes._M_elems[0xf].type.id,*(uint64_t *)(curr + 0x18),rhs,"offset > memory");
      trapIfGt((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
               lanes._M_elems[0xf].type.id,uVar9,rhs - *(long *)(curr + 0x18),"final > memory");
      uVar9 = uVar9 + *(long *)(curr + 0x18);
      trapIfGt((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
               lanes._M_elems[0xf].type.id,(ulong)uVar4,rhs,"bytes > memory");
      trapIfGt((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
               lanes._M_elems[0xf].type.id,uVar9,rhs - uVar4,"highest > memory");
      wasm::Literal::~Literal((Literal *)&vecFlow.breakTo.super_IString.str._M_str);
      if (ptrFlow.breakTo.super_IString.str._M_str +
          ((long)((long)vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
          3) * -0x5555555555555555 != (char *)0x1) goto LAB_0013112d;
      wasm::Literal::Literal((Literal *)local_78,(Literal *)&vecFlow);
      switch(*(undefined4 *)(curr + 0x10)) {
      case 0:
      case 4:
        wasm::Literal::getLanesUI8x16();
        cVar1 = wasm::SIMDLoadStoreLane::isStore();
        if (cVar1 == '\0') {
          bVar2 = (**(code **)(**(long **)(lanes._M_elems[0xf].type.id + 0x200) + 0x70))
                            (*(long **)(lanes._M_elems[0xf].type.id + 0x200),uVar9,info.instance,
                             info.name.super_IString.str._M_len);
          vec.type.id._0_4_ = (uint)bVar2;
          wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&vec.type);
          wasm::Literal::~Literal((Literal *)&vec.type);
          wasm::Literal::Literal((Literal *)&info.name.super_IString.str._M_str,(array *)local_320);
          Flow::Flow(__return_storage_ptr__,(Literal *)&info.name.super_IString.str._M_str);
          wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
        }
        else {
          if (lanes._M_elems[(byte)curr[0x28]].field_0.func.super_IString.str._M_str != (char *)0x2)
          {
LAB_0013116b:
            __assert_fail("type == Type::i32",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                          ,0x120,"int32_t wasm::Literal::geti32() const");
          }
          (**(code **)(**(long **)(lanes._M_elems[0xf].type.id + 0x200) + 0xb0))
                    (*(long **)(lanes._M_elems[0xf].type.id + 0x200),uVar9,
                     (int)(char)lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type.id,info.instance,
                     info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                            fixed._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        lVar8 = 0x168;
        do {
          wasm::Literal::~Literal((Literal *)((long)lanes._M_elems + lVar8 + -8));
          lVar8 = lVar8 + -0x18;
        } while (lVar8 != -0x18);
        break;
      case 1:
      case 5:
        wasm::Literal::getLanesUI16x8();
        cVar1 = wasm::SIMDLoadStoreLane::isStore();
        if (cVar1 == '\0') {
          uVar3 = (**(code **)(**(long **)(lanes._M_elems[0xf].type.id + 0x200) + 0x80))
                            (*(long **)(lanes._M_elems[0xf].type.id + 0x200),uVar9,info.instance,
                             info.name.super_IString.str._M_len);
          vec.type.id._0_4_ = (uint)uVar3;
          wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&vec.type);
          wasm::Literal::~Literal((Literal *)&vec.type);
          wasm::Literal::Literal(&local_170,(array *)local_320);
          Flow::Flow(__return_storage_ptr__,&local_170);
          wasm::Literal::~Literal(&local_170);
        }
        else {
          if (lanes._M_elems[(byte)curr[0x28]].field_0.func.super_IString.str._M_str != (char *)0x2)
          goto LAB_0013116b;
          (**(code **)(**(long **)(lanes._M_elems[0xf].type.id + 0x200) + 0xb8))
                    (*(long **)(lanes._M_elems[0xf].type.id + 0x200),uVar9,
                     (int)(short)lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type.id,info.instance,
                     info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                            fixed._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        lVar8 = 0xa8;
        do {
          wasm::Literal::~Literal((Literal *)((long)lanes._M_elems + lVar8 + -8));
          lVar8 = lVar8 + -0x18;
        } while (lVar8 != -0x18);
        break;
      case 2:
      case 6:
        wasm::Literal::getLanesI32x4();
        cVar1 = wasm::SIMDLoadStoreLane::isStore();
        if (cVar1 == '\0') {
          uVar5 = (**(code **)(**(long **)(lanes._M_elems[0xf].type.id + 0x200) + 0x90))
                            (*(long **)(lanes._M_elems[0xf].type.id + 0x200),uVar9,info.instance,
                             info.name.super_IString.str._M_len);
          vec.type.id._0_4_ = uVar5;
          wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&vec.type);
          wasm::Literal::~Literal((Literal *)&vec.type);
          wasm::Literal::Literal(&local_158,(array *)local_320);
          Flow::Flow(__return_storage_ptr__,&local_158);
          wasm::Literal::~Literal(&local_158);
        }
        else {
          if (lanes._M_elems[(byte)curr[0x28]].field_0.func.super_IString.str._M_str != (char *)0x2)
          goto LAB_0013116b;
          (**(code **)(**(long **)(lanes._M_elems[0xf].type.id + 0x200) + 0xc0))
                    (*(long **)(lanes._M_elems[0xf].type.id + 0x200),uVar9,
                     (int)lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type.id,info.instance,
                     info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                            fixed._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        lVar8 = 0x48;
        do {
          wasm::Literal::~Literal((Literal *)((long)lanes._M_elems + lVar8 + -8));
          lVar8 = lVar8 + -0x18;
        } while (lVar8 != -0x18);
        break;
      case 3:
      case 7:
        wasm::Literal::getLanesI64x2();
        cVar1 = wasm::SIMDLoadStoreLane::isStore();
        if (cVar1 == '\0') {
          vec.type.id = (**(code **)(**(long **)(lanes._M_elems[0xf].type.id + 0x200) + 0xa0))
                                  (*(long **)(lanes._M_elems[0xf].type.id + 0x200),uVar9,
                                   info.instance,info.name.super_IString.str._M_len);
          wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&vec.type);
          wasm::Literal::~Literal((Literal *)&vec.type);
          wasm::Literal::Literal(&local_140,(array *)local_320);
          Flow::Flow(__return_storage_ptr__,&local_140);
          wasm::Literal::~Literal(&local_140);
        }
        else {
          if (lanes._M_elems[(byte)curr[0x28]].field_0.func.super_IString.str._M_str != (char *)0x3)
          {
LAB_0013114c:
            __assert_fail("type == Type::i64",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                          ,0x129,"int64_t wasm::Literal::geti64() const");
          }
          (**(code **)(**(long **)(lanes._M_elems[0xf].type.id + 0x200) + 200))
                    (*(long **)(lanes._M_elems[0xf].type.id + 0x200),uVar9,
                     lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type.id,info.instance,
                     info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                            fixed._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        lVar8 = 0x18;
        do {
          wasm::Literal::~Literal((Literal *)((long)lanes._M_elems + lVar8 + -8));
          lVar8 = lVar8 + -0x18;
        } while (lVar8 != -0x18);
        break;
      default:
        wasm::handle_unreachable
                  ("unexpected op",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xf91);
      }
      wasm::Literal::~Literal((Literal *)local_78);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)ptrFlow.breakTo.super_IString.str._M_str;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&vecFlow);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)vecFlow.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&vecFlow);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_128;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&ptrFlow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)ptrFlow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  pFVar7 = (Flow *)wasm::Literal::~Literal((Literal *)&ptrFlow);
  return pFVar7;
}

Assistant:

Flow visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
    NOTE_ENTER("SIMDLoadStoreLane");
    Flow ptrFlow = self()->visit(curr->ptr);
    if (ptrFlow.breaking()) {
      return ptrFlow;
    }
    NOTE_EVAL1(ptrFlow);
    Flow vecFlow = self()->visit(curr->vec);
    if (vecFlow.breaking()) {
      return vecFlow;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    Address addr = info.instance->getFinalAddress(
      curr, ptrFlow.getSingleValue(), curr->getMemBytes(), memorySize);
    Literal vec = vecFlow.getSingleValue();
    switch (curr->op) {
      case Load8LaneVec128:
      case Store8LaneVec128: {
        std::array<Literal, 16> lanes = vec.getLanesUI8x16();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load8u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store8(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load16LaneVec128:
      case Store16LaneVec128: {
        std::array<Literal, 8> lanes = vec.getLanesUI16x8();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load16u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store16(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load32LaneVec128:
      case Store32LaneVec128: {
        std::array<Literal, 4> lanes = vec.getLanesI32x4();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load32u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store32(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Store64LaneVec128:
      case Load64LaneVec128: {
        std::array<Literal, 2> lanes = vec.getLanesI64x2();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load64u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store64(
            addr, lanes[curr->index].geti64(), info.name);
          return {};
        }
      }
    }
    WASM_UNREACHABLE("unexpected op");
  }